

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O0

string * __thiscall
groundupdb::BucketQuery::bucket_abi_cxx11_(string *__return_storage_ptr__,BucketQuery *this)

{
  string *psVar1;
  BucketQuery *this_local;
  
  psVar1 = (string *)
           std::
           unique_ptr<groundupdb::BucketQuery::Impl,_std::default_delete<groundupdb::BucketQuery::Impl>_>
           ::operator->(&this->mImpl);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string
BucketQuery::bucket() const {
  return mImpl->m_bucket;
}